

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Scanner::scanBlockScalar(Scanner *this,bool IsLiteral)

{
  ilist_node_base<false> *piVar1;
  bool bVar2;
  uint uVar3;
  iterator Position;
  char *pcVar4;
  ilist_node_base<false> *piVar5;
  uint uVar6;
  size_type NumInputs;
  char *in_start;
  bool IsDone;
  char ChompingIndicator;
  uint BlockIndent;
  SmallString<256U> Str;
  bool local_1aa;
  char local_1a9;
  uint local_1a8;
  uint local_1a4;
  iterator local_1a0;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined8 uStack_190;
  ilist_node_base<false> *local_188;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  SmallVectorImpl<char> local_140;
  undefined1 local_130 [256];
  
  if ((*this->Current != '>') && (*this->Current != '|')) {
    __assert_fail("*Current == \'|\' || *Current == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                  ,0x62c,"bool llvm::yaml::Scanner::scanBlockScalar(bool)");
  }
  skip(this,1);
  local_1aa = false;
  bVar2 = scanBlockScalarHeader(this,&local_1a9,&local_1a8,&local_1aa);
  if (bVar2) {
    if (local_1aa != false) {
      return true;
    }
    NumInputs = 0;
    uVar3 = this->Indent;
    if (this->Indent < 1) {
      uVar3 = 0;
    }
    local_1a0 = this->Current;
    local_1a4 = 0;
    if (local_1a8 == 0) {
      bVar2 = findBlockScalarIndent(this,&local_1a8,uVar3,&local_1a4,&local_1aa);
      if (!bVar2) goto LAB_001cdb57;
      NumInputs = (size_type)local_1a4;
    }
    uVar6 = (uint)NumInputs;
    local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = local_130;
    local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x100;
    if ((local_1aa & 1U) == 0) {
      while( true ) {
        uVar6 = (uint)NumInputs;
        bVar2 = scanBlockScalarIndent(this,local_1a8,uVar3,&local_1aa);
        if (!bVar2) break;
        if (local_1aa != false) goto LAB_001cdb23;
        in_start = this->Current;
        pcVar4 = in_start;
        do {
          Position = pcVar4;
          pcVar4 = skip_nb_char(this,Position);
        } while (pcVar4 != Position);
        this->Column = this->Column + ((int)Position - (int)in_start);
        this->Current = pcVar4;
        if (Position != in_start) {
          local_198 = CONCAT31(local_198._1_3_,10);
          SmallVectorImpl<char>::append(&local_140,NumInputs,(char *)&local_198);
          SmallVectorImpl<char>::append<char_const*,void>(&local_140,in_start,this->Current);
          in_start = this->Current;
          uVar6 = 0;
        }
        if ((in_start == this->End) || (bVar2 = consumeLineBreakIfPresent(this), !bVar2))
        goto LAB_001cdb23;
        NumInputs = (size_type)(uVar6 + 1);
      }
      bVar2 = false;
    }
    else {
LAB_001cdb23:
      if (local_1a9 == '-') {
        uVar3 = 0;
      }
      else if (local_1a9 == '+') {
        uVar3 = 1;
        if (uVar6 != 0) {
          uVar3 = uVar6;
        }
        if (this->Current != this->End) {
          uVar3 = uVar6;
        }
      }
      else {
        uVar3 = (uint)(local_140.super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0);
      }
      local_198 = CONCAT31(local_198._1_3_,10);
      SmallVectorImpl<char>::append(&local_140,(ulong)uVar3,(char *)&local_198);
      if (this->FlowLevel == 0) {
        this->IsSimpleKeyAllowed = true;
      }
      local_178 = 0;
      local_170 = 0;
      local_198 = 0x13;
      local_188 = (ilist_node_base<false> *)(this->Current + -(long)local_1a0);
      uStack_190 = local_1a0;
      local_180 = &local_170;
      if ((undefined1 *)
          local_140.super_SmallVectorTemplateBase<char,_true>.
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
          (undefined1 *)0x0) {
        local_160 = &local_150;
        local_158 = 0;
        local_150 = 0;
      }
      else {
        local_160 = &local_150;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,
                   local_140.super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   (undefined1 *)
                   ((long)local_140.super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                   (local_140.super_SmallVectorTemplateBase<char,_true>.
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                   0xffffffff)));
      }
      std::__cxx11::string::operator=((string *)&local_180,(string *)&local_160);
      if (local_160 != &local_150) {
        operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
      }
      piVar5 = (ilist_node_base<false> *)
               BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         (&(this->TokenQueue).
                           super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                          0x10);
      piVar5->Prev = (ilist_node_base<false> *)0x0;
      piVar5->Next = (ilist_node_base<false> *)0x0;
      *(undefined4 *)&piVar5[1].Prev = local_198;
      *(undefined4 *)((long)&piVar5[1].Prev + 4) = uStack_194;
      *(undefined4 *)&piVar5[1].Next = (undefined4)uStack_190;
      *(undefined4 *)((long)&piVar5[1].Next + 4) = uStack_190._4_4_;
      piVar5[2].Prev = local_188;
      piVar5[2].Next = (ilist_node_base<false> *)&piVar5[3].Next;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&piVar5[2].Next,local_180,local_180 + local_178);
      piVar1 = (this->TokenQueue).List.Sentinel.
               super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
               .super_node_base_type.Prev;
      piVar5->Next = (ilist_node_base<false> *)&(this->TokenQueue).List;
      piVar5->Prev = piVar1;
      piVar1->Next = piVar5;
      (this->TokenQueue).List.Sentinel.
      super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
      .super_node_base_type.Prev = piVar5;
      if (local_180 != &local_170) {
        operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
      }
      bVar2 = true;
    }
    if ((undefined1 *)
        local_140.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_130) {
      free(local_140.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
    }
  }
  else {
LAB_001cdb57:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Scanner::scanBlockScalar(bool IsLiteral) {
  // Eat '|' or '>'
  assert(*Current == '|' || *Current == '>');
  skip(1);

  char ChompingIndicator;
  unsigned BlockIndent;
  bool IsDone = false;
  if (!scanBlockScalarHeader(ChompingIndicator, BlockIndent, IsDone))
    return false;
  if (IsDone)
    return true;

  auto Start = Current;
  unsigned BlockExitIndent = Indent < 0 ? 0 : (unsigned)Indent;
  unsigned LineBreaks = 0;
  if (BlockIndent == 0) {
    if (!findBlockScalarIndent(BlockIndent, BlockExitIndent, LineBreaks,
                               IsDone))
      return false;
  }

  // Scan the block's scalars body.
  SmallString<256> Str;
  while (!IsDone) {
    if (!scanBlockScalarIndent(BlockIndent, BlockExitIndent, IsDone))
      return false;
    if (IsDone)
      break;

    // Parse the current line.
    auto LineStart = Current;
    advanceWhile(&Scanner::skip_nb_char);
    if (LineStart != Current) {
      Str.append(LineBreaks, '\n');
      Str.append(StringRef(LineStart, Current - LineStart));
      LineBreaks = 0;
    }

    // Check for EOF.
    if (Current == End)
      break;

    if (!consumeLineBreakIfPresent())
      break;
    ++LineBreaks;
  }

  if (Current == End && !LineBreaks)
    // Ensure that there is at least one line break before the end of file.
    LineBreaks = 1;
  Str.append(getChompedLineBreaks(ChompingIndicator, LineBreaks, Str), '\n');

  // New lines may start a simple key.
  if (!FlowLevel)
    IsSimpleKeyAllowed = true;

  Token T;
  T.Kind = Token::TK_BlockScalar;
  T.Range = StringRef(Start, Current - Start);
  T.Value = Str.str().str();
  TokenQueue.push_back(T);
  return true;
}